

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O3

void cjson_create_object_reference_should_create_an_object_reference(void)

{
  cJSON *object;
  cJSON *item;
  cJSON *item_00;
  cJSON_bool in_R8D;
  long in_FS_OFFSET;
  char key [7];
  char acStack_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  object = (cJSON *)(*global_hooks.allocate)(0x40);
  if (object != (cJSON *)0x0) {
    object->child = (cJSON *)0x0;
    *(undefined8 *)&object->type = 0;
    object->valuedouble = 0.0;
    object->string = (char *)0x0;
    object->valuestring = (char *)0x0;
    *(undefined8 *)&object->valueint = 0;
    object->next = (cJSON *)0x0;
    object->prev = (cJSON *)0x0;
    object->type = 0x40;
  }
  item = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item == (cJSON *)0x0) {
    builtin_strncpy(acStack_28,"number",7);
    UnityFail(" Expected TRUE Was FALSE",0x251);
  }
  else {
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    item->type = 8;
    item->valuedouble = 42.0;
    item->valueint = 0x2a;
    builtin_strncpy(acStack_28,"number",7);
  }
  if ((object == (cJSON *)0x0) || ((char)object->type != '@')) {
    UnityFail(" Expected TRUE Was FALSE",0x252);
  }
  add_item_to_object(object,acStack_28,item,(internal_hooks *)0x1,in_R8D);
  item_00 = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item_00 == (cJSON *)0x0) {
    if (_DAT_00000010 != item) {
      UnityFail(" Expected TRUE Was FALSE",0x256);
    }
  }
  else {
    item_00->child = (cJSON *)0x0;
    *(undefined8 *)&item_00->type = 0;
    item_00->valuedouble = 0.0;
    item_00->string = (char *)0x0;
    item_00->valuestring = (char *)0x0;
    *(undefined8 *)&item_00->valueint = 0;
    item_00->next = (cJSON *)0x0;
    item_00->prev = (cJSON *)0x0;
    item_00->type = 0x140;
    item_00->child = item;
  }
  UnityAssertEqualNumber(0x140,(long)item_00->type,(char *)0x0,599,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(object);
  cJSON_Delete(item_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_create_object_reference_should_create_an_object_reference(void)
{
    cJSON *number_reference = NULL;
    cJSON *number_object = cJSON_CreateObject();
    cJSON *number = cJSON_CreateNumber(42);
    const char key[] = "number";

    TEST_ASSERT_TRUE(cJSON_IsNumber(number));
    TEST_ASSERT_TRUE(cJSON_IsObject(number_object));
    cJSON_AddItemToObjectCS(number_object, key, number);

    number_reference = cJSON_CreateObjectReference(number);
    TEST_ASSERT_TRUE(number_reference->child == number);
    TEST_ASSERT_EQUAL_INT(cJSON_Object | cJSON_IsReference, number_reference->type);

    cJSON_Delete(number_object);
    cJSON_Delete(number_reference);
}